

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

MMAL_PARAM_EXPOSUREMETERINGMODE_T __thiscall
raspicam::_private::Private_Impl_Still::convertMetering
          (Private_Impl_Still *this,RASPICAM_METERING metering)

{
  RASPICAM_METERING RVar1;
  
  RVar1 = RASPICAM_METERING_AVERAGE;
  if (metering - RASPICAM_METERING_SPOT < 3) {
    RVar1 = metering;
  }
  return RVar1;
}

Assistant:

MMAL_PARAM_EXPOSUREMETERINGMODE_T Private_Impl_Still::convertMetering ( RASPICAM_METERING metering ) {
            switch ( metering ) {
            case RASPICAM_METERING_AVERAGE:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_AVERAGE;
            case RASPICAM_METERING_SPOT:
                return  MMAL_PARAM_EXPOSUREMETERINGMODE_SPOT;
            case RASPICAM_METERING_BACKLIT:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_BACKLIT;
            case RASPICAM_METERING_MATRIX:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_MATRIX;
            default:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_AVERAGE;
            }
        }